

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemListView.cpp
# Opt level: O0

void __thiscall QFileSystemListView::QFileSystemListView(QFileSystemListView *this,QWidget *parent)

{
  void *pvVar1;
  QWidget *in_RSI;
  QListView *in_RDI;
  QFileSystemListView *in_stack_00000098;
  QFileSystemListViewPrivate *in_stack_000000a0;
  QString *in_stack_ffffffffffffffd8;
  QFileSystemListView *in_stack_ffffffffffffffe0;
  
  QListView::QListView(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00269c18;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QFileSystemListView_00269f28;
  pvVar1 = operator_new(0x28);
  QFileSystemListViewPrivate::QFileSystemListViewPrivate(in_stack_000000a0,in_stack_00000098);
  *(void **)(in_RDI + 0x28) = pvVar1;
  QListView::setUniformItemSizes(SUB81(in_RDI,0));
  QAbstractItemView::setModel((QAbstractItemModel *)in_RDI);
  QDir::homePath();
  setRootPath(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  QString::~QString((QString *)0x233a77);
  return;
}

Assistant:

QFileSystemListView::QFileSystemListView(QWidget *parent)
    : QListView(parent)
    , d(new QFileSystemListViewPrivate(this)) {
    setUniformItemSizes(true);
    QListView::setModel(d->model);
    setRootPath(QDir::homePath());
}